

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O3

void __thiscall
AVSInterface::AVSInDelegator::Read
          (AVSInDelegator *this,char *name,vector<int,_std::allocator<int>_> *output)

{
  uint uVar1;
  pointer piVar2;
  iterator __position;
  char cVar3;
  int iVar4;
  int iVar5;
  AVSValue *pAVar6;
  code *pcVar7;
  long lVar8;
  long *plVar9;
  undefined8 *puVar10;
  int iVar11;
  AVSValue arg;
  int local_44;
  AVSValue local_40;
  
  iVar4 = NameToIndex(this,name);
  if (AVS_linkage != (AVS_Linkage *)0x0) {
    pAVar6 = &this->_args;
    uVar1 = AVS_linkage->Size;
    if (0x508 < uVar1) {
      pcVar7 = (code *)AVS_linkage->AVSValue_OPERATOR_INDEX;
      plVar9 = (long *)((long)&pAVar6->type + *(long *)&AVS_linkage->field_0x510);
      if (((ulong)pcVar7 & 1) != 0) {
        pcVar7 = *(code **)(pcVar7 + *plVar9 + -1);
      }
      pAVar6 = (AVSValue *)(*pcVar7)(plVar9,iVar4);
      if (AVS_linkage == (AVS_Linkage *)0x0) goto LAB_0010f1fd;
      uVar1 = AVS_linkage->Size;
    }
    if (0x4d8 < uVar1) {
      pcVar7 = (code *)AVS_linkage->AVSValue_CONSTRUCTOR9;
      plVar9 = (long *)((long)&local_40.type + *(long *)&AVS_linkage->field_0x4e0);
      if (((ulong)pcVar7 & 1) != 0) {
        pcVar7 = *(code **)(pcVar7 + *plVar9 + -1);
      }
      (*pcVar7)(plVar9,pAVar6);
      if (AVS_linkage == (AVS_Linkage *)0x0) goto LAB_0010f1fd;
    }
    if (0x578 < (uint)AVS_linkage->Size) {
      pcVar7 = (code *)AVS_linkage->IsArray;
      if (((ulong)pcVar7 & 1) != 0) {
        pcVar7 = *(code **)(pcVar7 + *(long *)((long)&local_40.type +
                                              *(long *)&AVS_linkage->field_0x580) + -1);
      }
      cVar3 = (*pcVar7)();
      if (cVar3 != '\0') {
        iVar4 = 0;
        if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x628 < (uint)AVS_linkage->Size)) {
          pcVar7 = (code *)AVS_linkage->ArraySize;
          if (((ulong)pcVar7 & 1) != 0) {
            pcVar7 = *(code **)(pcVar7 + *(long *)((long)&local_40.type +
                                                  *(long *)&AVS_linkage->field_0x630) + -1);
          }
          iVar4 = (*pcVar7)();
        }
        piVar2 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish != piVar2) {
          (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = piVar2;
        }
        if (0 < iVar4) {
          iVar11 = 0;
          do {
            iVar5 = 0;
            if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x508 < (uint)AVS_linkage->Size)) {
              pcVar7 = (code *)AVS_linkage->AVSValue_OPERATOR_INDEX;
              plVar9 = (long *)((long)&local_40.type + *(long *)&AVS_linkage->field_0x510);
              if (((ulong)pcVar7 & 1) != 0) {
                pcVar7 = *(code **)(pcVar7 + *plVar9 + -1);
              }
              lVar8 = (*pcVar7)(plVar9,iVar11);
              iVar5 = 0;
              if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x5a8 < (uint)AVS_linkage->Size)) {
                pcVar7 = (code *)AVS_linkage->AsInt1;
                plVar9 = (long *)(lVar8 + *(long *)&AVS_linkage->field_0x5b0);
                if (((ulong)pcVar7 & 1) != 0) {
                  pcVar7 = *(code **)(pcVar7 + *plVar9 + -1);
                }
                iVar5 = (*pcVar7)(plVar9);
              }
            }
            local_44 = iVar5;
            __position._M_current =
                 (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (output,__position,&local_44);
            }
            else {
              *__position._M_current = local_44;
              (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            iVar11 = iVar11 + 1;
          } while (iVar4 != iVar11);
        }
        AVSValue::~AVSValue(&local_40);
        return;
      }
    }
  }
LAB_0010f1fd:
  puVar10 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar10 = "Argument is not array";
  __cxa_throw(puVar10,&char_const*::typeinfo,0);
}

Assistant:

void Read(const char* name, std::vector<int>& output) override {
      auto arg = _args[NameToIndex(name)];
      if (!arg.IsArray())
        throw "Argument is not array";
      auto size = arg.ArraySize();
      output.clear();
      for (int i = 0; i < size; i++)
        output.push_back(arg[i].AsInt());
    }